

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::maybe_emit_array_assignment
          (CompilerMSL *this,uint32_t id_lhs,uint32_t id_rhs)

{
  uint uVar1;
  Types TVar2;
  uint32_t id;
  StorageClass SVar3;
  StorageClass SVar4;
  size_t sVar5;
  Variant *this_00;
  undefined1 local_a8 [40];
  SPIRVariable *p_v_lhs;
  undefined1 local_70 [32];
  undefined1 local_50 [40];
  SPIRVariable *var;
  SPIRType *type;
  uint32_t id_rhs_local;
  uint32_t id_lhs_local;
  CompilerMSL *this_local;
  
  type._0_4_ = id_rhs;
  type._4_4_ = id_lhs;
  _id_rhs_local = this;
  var = (SPIRVariable *)Compiler::expression_type((Compiler *)this,id_rhs);
  sVar5 = VectorView<unsigned_int>::size(&(((SPIRType *)var)->array).super_VectorView<unsigned_int>)
  ;
  if (sVar5 == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_50._32_8_ = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,type._4_4_);
    if ((((SPIRVariable *)local_50._32_8_ == (SPIRVariable *)0x0) ||
        ((((SPIRVariable *)local_50._32_8_)->remapped_variable & 1U) == 0)) ||
       ((((SPIRVariable *)local_50._32_8_)->statically_assigned & 1U) == 0)) {
      this_00 = VectorView<spirv_cross::Variant>::operator[]
                          (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>,(ulong)(uint32_t)type);
      TVar2 = Variant::get_type(this_00);
      if (((TVar2 == TypeConstant) && ((SPIRVariable *)local_50._32_8_ != (SPIRVariable *)0x0)) &&
         ((*(bool *)(local_50._32_8_ + 0x99) & 1U) != 0)) {
        CompilerGLSL::to_expression_abi_cxx11_
                  ((CompilerGLSL *)local_50,(uint32_t)this,SUB41(type._4_4_,0));
        Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,(uint32_t)type);
        CompilerGLSL::constant_expression_abi_cxx11_((CompilerGLSL *)local_70,(SPIRConstant *)this);
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   (char (*) [4])0x4f38c2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   (char (*) [2])0x4d9ce2);
        ::std::__cxx11::string::~string((string *)local_70);
        ::std::__cxx11::string::~string((string *)local_50);
        this_local._7_1_ = true;
      }
      else {
        local_a8._32_8_ = Compiler::maybe_get_backing_variable((Compiler *)this,type._4_4_);
        if ((SPIRVariable *)local_a8._32_8_ != (SPIRVariable *)0x0) {
          id = TypedID::operator_cast_to_unsigned_int
                         ((TypedID *)&(((SPIRVariable *)local_a8._32_8_)->super_IVariant).self);
          CompilerGLSL::flush_variable_declaration(&this->super_CompilerGLSL,id);
        }
        CompilerGLSL::to_expression_abi_cxx11_
                  ((CompilerGLSL *)local_a8,(uint32_t)this,SUB41(type._4_4_,0));
        uVar1 = (uint32_t)type;
        SVar3 = Compiler::get_expression_effective_storage_class((Compiler *)this,type._4_4_);
        SVar4 = Compiler::get_expression_effective_storage_class((Compiler *)this,(uint32_t)type);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x30])
                  (this,local_a8,(ulong)uVar1,(ulong)SVar3,(ulong)SVar4);
        ::std::__cxx11::string::~string((string *)local_a8);
        Compiler::register_write((Compiler *)this,type._4_4_);
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerMSL::maybe_emit_array_assignment(uint32_t id_lhs, uint32_t id_rhs)
{
	// We only care about assignments of an entire array
	auto &type = expression_type(id_rhs);
	if (type.array.size() == 0)
		return false;

	auto *var = maybe_get<SPIRVariable>(id_lhs);

	// Is this a remapped, static constant? Don't do anything.
	if (var && var->remapped_variable && var->statically_assigned)
		return true;

	if (ir.ids[id_rhs].get_type() == TypeConstant && var && var->deferred_declaration)
	{
		// Special case, if we end up declaring a variable when assigning the constant array,
		// we can avoid the copy by directly assigning the constant expression.
		// This is likely necessary to be able to use a variable as a true look-up table, as it is unlikely
		// the compiler will be able to optimize the spvArrayCopy() into a constant LUT.
		// After a variable has been declared, we can no longer assign constant arrays in MSL unfortunately.
		statement(to_expression(id_lhs), " = ", constant_expression(get<SPIRConstant>(id_rhs)), ";");
		return true;
	}

	// Ensure the LHS variable has been declared
	auto *p_v_lhs = maybe_get_backing_variable(id_lhs);
	if (p_v_lhs)
		flush_variable_declaration(p_v_lhs->self);

	emit_array_copy(to_expression(id_lhs), id_rhs, get_expression_effective_storage_class(id_lhs),
	                get_expression_effective_storage_class(id_rhs));
	register_write(id_lhs);

	return true;
}